

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetAttributes
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  byte bVar1;
  JavascriptLibrary *pJVar2;
  ScriptContext *this_00;
  ulong uVar3;
  bool bVar4;
  BOOL BVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_40;
  uint32 local_38;
  undefined4 local_34;
  uint32 indexVal;
  
  uVar6 = (ulong)(uint)this->propertyCount;
  if (this->propertyCount < 1) {
    uVar6 = 0;
  }
  uVar3 = 0;
  while( true ) {
    uVar7 = uVar3;
    local_34 = (undefined4)CONCAT71(in_register_00000009,attributes);
    if (uVar6 * 0x10 + 0x10 == uVar7 + 0x10) break;
    uVar3 = uVar7 + 0x10;
    if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + uVar7) + 8) == propertyId) {
      bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + uVar7);
      if ((bVar1 & 8) == 0) {
        *(byte *)((long)&this->descriptors[0].field_1 + uVar7) = attributes & 7 | bVar1 & 0xf0;
        if ((attributes & 1) != 0) {
          DynamicObject::SetHasNoEnumerableProperties(instance,false);
        }
        pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
        WriteBarrierSet(&local_40,&pJVar2->typesWithOnlyWritablePropertyProtoChain);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                  (local_40.ptr,&this->super_DynamicTypeHandler,
                   *(PropertyAttributes *)((long)&this->descriptors[0].field_1 + uVar7),propertyId,
                   (pJVar2->super_JavascriptLibraryBase).scriptContext.ptr);
      }
      return 1;
    }
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  bVar4 = DynamicObject::HasObjectArray(instance);
  if (!bVar4) {
    return 1;
  }
  BVar5 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38);
  if (BVar5 == 0) {
    return 1;
  }
  BVar5 = DynamicTypeHandler::SetItemAttributes
                    (&this->super_DynamicTypeHandler,instance,local_38,(PropertyAttributes)local_34)
  ;
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return true;
                }

                descriptors[i].Attributes = (descriptors[i].Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
                if (descriptors[i].Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptors[i].Attributes, propertyId, library->GetScriptContext());
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemAttributes(instance, indexVal, attributes);
        }

        return true;
    }